

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

bool isLessInfeasibleDSECandidate(HighsLogOptions *log_options,HighsLp *lp)

{
  int iVar1;
  pointer piVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  double dVar9;
  value_type_conflict2 local_3c;
  vector<int,_std::allocator<int>_> col_length_k;
  
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::resize(&col_length_k,0x19,&local_3c);
  piVar2 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = 0xffffffffffffffff;
  lVar3 = 0;
  do {
    iVar1 = lp->num_col_;
    if (iVar1 <= lVar3) {
      bVar4 = (double)piVar2[iVar1] / (double)iVar1 <= 6.0;
      pcVar8 = "is not";
      if (bVar4) {
        pcVar8 = "is";
      }
      highsLogDev(log_options,kInfo,
                  "LP %s has all |entries|=1; max column count = %d (limit %d); average column count = %0.2g (limit %d): LP is %s a candidate for LiDSE\n"
                  ,(lp->model_name_)._M_dataplus._M_p,uVar7,0x18,6,pcVar8);
LAB_00262032:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&col_length_k.super__Vector_base<int,_std::allocator<int>_>);
      return bVar4;
    }
    uVar5 = (long)piVar2[lVar3 + 1] - (long)piVar2[lVar3];
    if ((int)uVar7 < (int)uVar5) {
      uVar7 = uVar5;
    }
    uVar7 = uVar7 & 0xffffffff;
    if (0x18 < (int)uVar5) {
LAB_00262030:
      bVar4 = false;
      goto LAB_00262032;
    }
    col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar5] =
         col_length_k.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar5] + 1;
    lVar6 = (long)piVar2[lVar3];
    lVar3 = lVar3 + 1;
    while (lVar6 < piVar2[lVar3]) {
      dVar9 = ABS((lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar6]);
      lVar6 = lVar6 + 1;
      if ((dVar9 != 1.0) || (NAN(dVar9))) goto LAB_00262030;
    }
  } while( true );
}

Assistant:

bool isLessInfeasibleDSECandidate(const HighsLogOptions& log_options,
                                  const HighsLp& lp) {
  HighsInt max_col_num_en = -1;
  const HighsInt max_allowed_col_num_en = 24;
  const HighsInt max_assess_col_num_en =
      std::max(HighsInt{9}, max_allowed_col_num_en);
  const HighsInt max_average_col_num_en = 6;
  vector<HighsInt> col_length_k;
  col_length_k.resize(1 + max_assess_col_num_en, 0);
  bool LiDSE_candidate = true;
  for (HighsInt col = 0; col < lp.num_col_; col++) {
    // Check limit on number of entries in the column has not been breached
    HighsInt col_num_en =
        lp.a_matrix_.start_[col + 1] - lp.a_matrix_.start_[col];
    max_col_num_en = std::max(col_num_en, max_col_num_en);
    if (col_num_en > max_assess_col_num_en) return false;
    col_length_k[col_num_en]++;
    for (HighsInt en = lp.a_matrix_.start_[col];
         en < lp.a_matrix_.start_[col + 1]; en++) {
      double value = lp.a_matrix_.value_[en];
      // All nonzeros must be +1 or -1
      if (fabs(value) != 1) return false;
    }
  }
  double average_col_num_en = lp.a_matrix_.start_[lp.num_col_];
  average_col_num_en = average_col_num_en / lp.num_col_;
  LiDSE_candidate =
      LiDSE_candidate && average_col_num_en <= max_average_col_num_en;
  highsLogDev(log_options, HighsLogType::kInfo,
              "LP %s has all |entries|=1; max column count = %" HIGHSINT_FORMAT
              " (limit %" HIGHSINT_FORMAT
              "); average "
              "column count = %0.2g (limit %" HIGHSINT_FORMAT
              "): LP is %s a candidate for LiDSE\n",
              lp.model_name_.c_str(), max_col_num_en, max_allowed_col_num_en,
              average_col_num_en, max_average_col_num_en,
              LiDSE_candidate ? "is" : "is not");
  return LiDSE_candidate;
}